

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void maybe_set_pagemode(QPDF *pdf,string *pagemode)

{
  bool bVar1;
  QPDFObjectHandle local_a8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  string local_58 [32];
  QPDFObjectHandle local_38;
  undefined1 local_28 [8];
  QPDFObjectHandle root;
  string *pagemode_local;
  QPDF *pdf_local;
  
  root.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pagemode;
  QPDF::getRoot((QPDF *)local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"/PageMode",&local_59);
  QPDFObjectHandle::getKey(&local_38,(string *)local_28);
  bVar1 = QPDFObjectHandle::isNull(&local_38);
  QPDFObjectHandle::~QPDFObjectHandle(&local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"/PageMode",&local_91);
    QPDFObjectHandle::newName
              (&local_a8,
               (string *)
               root.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_28,&local_90,&local_a8);
    QPDFObjectHandle::~QPDFObjectHandle(&local_a8);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_28);
  return;
}

Assistant:

static void
maybe_set_pagemode(QPDF& pdf, std::string const& pagemode)
{
    auto root = pdf.getRoot();
    if (root.getKey("/PageMode").isNull()) {
        root.replaceKey("/PageMode", QPDFObjectHandle::newName(pagemode));
    }
}